

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetStringWithHighBit::~TestsetStringWithHighBit
          (TestsetStringWithHighBit *this)

{
  TestsetStringWithHighBit *this_local;
  
  ~TestsetStringWithHighBit(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(setStringWithHighBit)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX42.xml" );

  FIX::Headline headline( "client" );
  FIX42::News msg( headline );

  FIX::RawDataLength data_len = rand() % 100;
  FIX::RawData data;

  std::string s;
  char cc = -92;
  s.assign(data_len, cc);

  data.setValue(s);

  msg.set(data_len);
  msg.set(data);
  std::string str = msg.toString();

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}